

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_ae8::ndiSSTATHelper(ndicapi *pol,char *command,char *commandReply)

{
  char *pcVar1;
  char cVar2;
  int i;
  long lVar3;
  byte bVar4;
  char cVar5;
  
  lVar3 = 0;
  bVar4 = 0;
  do {
    cVar2 = command[lVar3 + 6];
    cVar5 = -0x57;
    if (((5 < (byte)(cVar2 + 0x9fU)) && (cVar5 = -0x37, 5 < (byte)(cVar2 + 0xbfU))) &&
       (cVar5 = '\0', 9 < (byte)(cVar2 - 0x30U))) break;
    bVar4 = cVar5 + cVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if ((bVar4 & 1) != 0) {
    pol->SstatControl[0] = *commandReply;
    pcVar1 = commandReply + 1;
    commandReply = commandReply + 2;
    pol->SstatControl[1] = *pcVar1;
  }
  if ((bVar4 & 2) != 0) {
    pol->SstatSensor[0] = *commandReply;
    pcVar1 = commandReply + 1;
    commandReply = commandReply + 2;
    pol->SstatSensor[1] = *pcVar1;
  }
  if ((bVar4 & 4) != 0) {
    pol->SstatTiu[0] = *commandReply;
    pol->SstatTiu[1] = commandReply[1];
  }
  return;
}

Assistant:

void ndiSSTATHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode;
    char* writePointer;

    // read the SSTAT command reply mode
    mode = ndiHexToUnsignedLong(&command[6], 4);

    if (mode & NDI_CONTROL)
    {
      writePointer = pol->SstatControl;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }

    if (mode & NDI_SENSORS)
    {
      writePointer = pol->SstatSensor;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }

    if (mode & NDI_TIU)
    {
      writePointer = pol->SstatTiu;
      *writePointer++ = *commandReply++;
      *writePointer++ = *commandReply++;
    }
  }